

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O1

Joint * __thiscall
CS248::DynamicScene::Skeleton::loadJoint
          (Skeleton *this,XMLElement *jointNode,
          set<double,_std::less<double>,_std::allocator<double>_> *knotTimes)

{
  pointer *pppJVar1;
  iterator iVar2;
  Skeleton *this_00;
  Joint *this_01;
  XMLElement *pXVar3;
  XMLElement *pXVar4;
  mapped_type *pmVar5;
  double dVar6;
  Joint *joint;
  double time;
  Joint *childJoint;
  Joint *local_70;
  Joint *local_68;
  Joint *local_60;
  double local_58;
  double local_50;
  double local_48;
  XMLElement *local_40;
  Skeleton *local_38;
  
  local_40 = jointNode;
  if (jointNode == (XMLElement *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Invalid joint node",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    local_70 = (Joint *)0x0;
  }
  else {
    this_01 = (Joint *)operator_new(0x160);
    local_38 = this;
    Joint::Joint(this_01,this);
    pXVar4 = local_40;
    local_70 = this_01;
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&local_40->super_XMLNode,"Axis");
    dVar6 = tinyxml2::XMLElement::DoubleAttribute(pXVar3,"x");
    (local_70->axis).x = dVar6;
    dVar6 = tinyxml2::XMLElement::DoubleAttribute(pXVar3,"y");
    (local_70->axis).y = dVar6;
    dVar6 = tinyxml2::XMLElement::DoubleAttribute(pXVar3,"z");
    (local_70->axis).z = dVar6;
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"RenderScale");
    dVar6 = tinyxml2::XMLElement::DoubleAttribute(pXVar3,"val");
    local_70->renderScale = dVar6;
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"CapsuleRadius");
    dVar6 = tinyxml2::XMLElement::DoubleAttribute(pXVar3,"val");
    local_70->capsuleRadius = dVar6;
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"Positions");
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"Knot");
    if (pXVar4 != (XMLElement *)0x0) {
      do {
        local_68 = (Joint *)tinyxml2::XMLElement::DoubleAttribute(pXVar4,"Time");
        local_48 = tinyxml2::XMLElement::DoubleAttribute(pXVar4,"x");
        local_50 = tinyxml2::XMLElement::DoubleAttribute(pXVar4,"y");
        local_58 = tinyxml2::XMLElement::DoubleAttribute(pXVar4,"z");
        local_60 = local_68;
        pmVar5 = std::
                 map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
                 ::operator[](&(local_70->super_SceneObject).positions.knots,(key_type *)&local_60);
        pmVar5->x = local_48;
        pmVar5->y = local_50;
        pmVar5->z = local_58;
        std::_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
        ::_M_insert_unique<double_const&>
                  ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                    *)knotTimes,(double *)&local_68);
        pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"Knot");
      } while (pXVar4 != (XMLElement *)0x0);
    }
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&local_40->super_XMLNode,"Rotations");
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"Knot");
    if (pXVar4 != (XMLElement *)0x0) {
      do {
        local_68 = (Joint *)tinyxml2::XMLElement::DoubleAttribute(pXVar4,"Time");
        local_48 = tinyxml2::XMLElement::DoubleAttribute(pXVar4,"x");
        local_50 = tinyxml2::XMLElement::DoubleAttribute(pXVar4,"y");
        local_58 = tinyxml2::XMLElement::DoubleAttribute(pXVar4,"z");
        local_60 = local_68;
        pmVar5 = std::
                 map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
                 ::operator[](&(local_70->super_SceneObject).rotations.knots,(key_type *)&local_60);
        pmVar5->x = local_48;
        pmVar5->y = local_50;
        pmVar5->z = local_58;
        std::_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
        ::_M_insert_unique<double_const&>
                  ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                    *)knotTimes,(double *)&local_68);
        pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"Knot");
      } while (pXVar4 != (XMLElement *)0x0);
    }
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&local_40->super_XMLNode,"Scales");
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"Knot");
    if (pXVar4 != (XMLElement *)0x0) {
      do {
        local_68 = (Joint *)tinyxml2::XMLElement::DoubleAttribute(pXVar4,"Time");
        local_48 = tinyxml2::XMLElement::DoubleAttribute(pXVar4,"x");
        local_50 = tinyxml2::XMLElement::DoubleAttribute(pXVar4,"y");
        local_58 = tinyxml2::XMLElement::DoubleAttribute(pXVar4,"z");
        local_60 = local_68;
        pmVar5 = std::
                 map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
                 ::operator[](&(local_70->super_SceneObject).scales.knots,(key_type *)&local_60);
        pmVar5->x = local_48;
        pmVar5->y = local_50;
        pmVar5->z = local_58;
        std::_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
        ::_M_insert_unique<double_const&>
                  ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                    *)knotTimes,(double *)&local_68);
        pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"Knot");
      } while (pXVar4 != (XMLElement *)0x0);
    }
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&local_40->super_XMLNode,"Children");
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"Joint");
    this_00 = local_38;
    if (pXVar4 != (XMLElement *)0x0) {
      do {
        local_60 = loadJoint(this_00,pXVar4,knotTimes);
        local_60->parent = local_70;
        iVar2._M_current =
             (local_70->kids).
             super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (local_70->kids).
            super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<CS248::DynamicScene::Joint*,std::allocator<CS248::DynamicScene::Joint*>>::
          _M_realloc_insert<CS248::DynamicScene::Joint*const&>
                    ((vector<CS248::DynamicScene::Joint*,std::allocator<CS248::DynamicScene::Joint*>>
                      *)&local_70->kids,iVar2,&local_60);
        }
        else {
          *iVar2._M_current = local_60;
          pppJVar1 = &(local_70->kids).
                      super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppJVar1 = *pppJVar1 + 1;
        }
        pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"Joint");
      } while (pXVar4 != (XMLElement *)0x0);
    }
    iVar2._M_current =
         (this_00->joints).
         super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this_00->joints).
        super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CS248::DynamicScene::Joint*,std::allocator<CS248::DynamicScene::Joint*>>::
      _M_realloc_insert<CS248::DynamicScene::Joint*const&>
                ((vector<CS248::DynamicScene::Joint*,std::allocator<CS248::DynamicScene::Joint*>> *)
                 &this_00->joints,iVar2,&local_70);
    }
    else {
      *iVar2._M_current = local_70;
      pppJVar1 = &(this_00->joints).
                  super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppJVar1 = *pppJVar1 + 1;
    }
  }
  return local_70;
}

Assistant:

Joint* CS248::DynamicScene::Skeleton::loadJoint(XMLElement* jointNode,
                                                 set<double>& knotTimes) {
  if (jointNode == nullptr) {
    cout << "Invalid joint node" << endl;
    return nullptr;
  }
  Joint* joint = new Joint(this);

  XMLElement* pElement = jointNode->FirstChildElement("Axis");
  joint->axis.x = pElement->DoubleAttribute("x");
  joint->axis.y = pElement->DoubleAttribute("y");
  joint->axis.z = pElement->DoubleAttribute("z");

  pElement = jointNode->FirstChildElement("RenderScale");
  joint->renderScale = pElement->DoubleAttribute("val");

  pElement = jointNode->FirstChildElement("CapsuleRadius");
  joint->capsuleRadius = pElement->DoubleAttribute("val");

  // positions
  pElement = jointNode->FirstChildElement("Positions");
  XMLElement* pListElement = pElement->FirstChildElement("Knot");
  while (pListElement != nullptr) {
    double time = pListElement->DoubleAttribute("Time");
    double x = pListElement->DoubleAttribute("x");
    double y = pListElement->DoubleAttribute("y");
    double z = pListElement->DoubleAttribute("z");
    Vector3D position(x, y, z);

    joint->positions.setValue(time, position);
    knotTimes.insert(time);
    pListElement = pListElement->NextSiblingElement("Knot");
  }

  // rotations
  pElement = jointNode->FirstChildElement("Rotations");
  pListElement = pElement->FirstChildElement("Knot");
  while (pListElement != nullptr) {
    double time = pListElement->DoubleAttribute("Time");
    double x = pListElement->DoubleAttribute("x");
    double y = pListElement->DoubleAttribute("y");
    double z = pListElement->DoubleAttribute("z");
    Vector3D rotation(x, y, z);

    joint->rotations.setValue(time, rotation);
    knotTimes.insert(time);
    pListElement = pListElement->NextSiblingElement("Knot");
  }

  // scales
  pElement = jointNode->FirstChildElement("Scales");
  pListElement = pElement->FirstChildElement("Knot");
  while (pListElement != nullptr) {
    double time = pListElement->DoubleAttribute("Time");
    double x = pListElement->DoubleAttribute("x");
    double y = pListElement->DoubleAttribute("y");
    double z = pListElement->DoubleAttribute("z");
    Vector3D scale(x, y, z);

    joint->scales.setValue(time, scale);
    knotTimes.insert(time);
    pListElement = pListElement->NextSiblingElement("Knot");
  }

  pElement = jointNode->FirstChildElement("Children");
  XMLElement* pChild = pElement->FirstChildElement("Joint");
  while (pChild != nullptr) {
    Joint* childJoint = loadJoint(pChild, knotTimes);
    childJoint->parent = joint;
    joint->kids.push_back(childJoint);
    pChild = pChild->NextSiblingElement("Joint");
  }

  joints.push_back(joint);

  return joint;
}